

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_fds.c
# Opt level: O3

void NES_FDS_SetRate(void *chip,UINT32 r)

{
  int iVar1;
  double dVar2;
  
  *(UINT32 *)((long)chip + 8) = r;
  iVar1 = 0;
  *(ulong *)((long)chip + 0x280) = CONCAT44(*(undefined4 *)((long)chip + 0xc),r >> 1) / (ulong)r;
  if (0 < *(int *)((long)chip + 0x20)) {
    dVar2 = exp(((double)*(int *)((long)chip + 0x20) * -6.28318) / (double)r);
    iVar1 = (int)(dVar2 * 4096.0);
  }
  *(int *)((long)chip + 0x278) = iVar1;
  *(int *)((long)chip + 0x27c) = 0x1000 - iVar1;
  return;
}

Assistant:

void NES_FDS_SetRate(void* chip, UINT32 r)
{
	NES_FDS* fds = (NES_FDS*)chip;
	double cutoff, leak;

	fds->rate = r;

	RC_SET_RATIO(&fds->tick_count, fds->clock, fds->rate);
	
	// configure lowpass filter
	cutoff = (double)fds->option[OPT_CUTOFF];
	leak = 0.0;
	if (cutoff > 0)
		leak = exp(-2.0 * 3.14159 * cutoff / fds->rate);
	fds->rc_k = (INT32)(leak * (double)(1<<RC_BITS));
	fds->rc_l = (1<<RC_BITS) - fds->rc_k;
}